

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O3

WebPIDecoder * WebPIDecode(uint8_t *data,size_t data_size,WebPDecoderConfig *config)

{
  VP8StatusCode VVar1;
  WebPIDecoder *pWVar2;
  WebPDecoderConfig *features;
  WebPBitstreamFeatures tmp_features;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  int local_28;
  uint32_t uStack_24;
  uint32_t uStack_20;
  uint32_t uStack_1c;
  uint32_t local_18;
  uint32_t uStack_14;
  
  local_28 = 0;
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 0;
  local_38 = 0;
  iStack_34 = 0;
  iStack_30 = 0;
  iStack_2c = 0;
  local_18 = 0;
  uStack_14 = 0;
  if (data_size != 0 && data != (uint8_t *)0x0) {
    features = (WebPDecoderConfig *)&stack0xffffffffffffffc8;
    if (config != (WebPDecoderConfig *)0x0) {
      features = config;
    }
    VVar1 = WebPGetFeaturesInternal(data,data_size,&features->input,0x210);
    if (VVar1 != VP8_STATUS_OK) {
      return (WebPIDecoder *)0x0;
    }
  }
  if (config == (WebPDecoderConfig *)0x0) {
    pWVar2 = NewDecoder((WebPDecBuffer *)0x0,(WebPBitstreamFeatures *)&stack0xffffffffffffffc8);
    return pWVar2;
  }
  pWVar2 = NewDecoder(&config->output,&config->input);
  if (pWVar2 == (WebPIDecoder *)0x0) {
    return (WebPIDecoder *)0x0;
  }
  (pWVar2->params).options = &config->options;
  return pWVar2;
}

Assistant:

WebPIDecoder* WebPIDecode(const uint8_t* data, size_t data_size,
                          WebPDecoderConfig* config) {
  WebPIDecoder* idec;
  WebPBitstreamFeatures tmp_features;
  WebPBitstreamFeatures* const features =
      (config == NULL) ? &tmp_features : &config->input;
  memset(&tmp_features, 0, sizeof(tmp_features));

  // Parse the bitstream's features, if requested:
  if (data != NULL && data_size > 0) {
    if (WebPGetFeatures(data, data_size, features) != VP8_STATUS_OK) {
      return NULL;
    }
  }

  // Create an instance of the incremental decoder
  idec = (config != NULL) ? NewDecoder(&config->output, features)
                          : NewDecoder(NULL, features);
  if (idec == NULL) {
    return NULL;
  }
  // Finish initialization
  if (config != NULL) {
    idec->params.options = &config->options;
  }
  return idec;
}